

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcStrash.c
# Opt level: O2

Abc_Obj_t * Abc_NodeStrash(Abc_Ntk_t *pNtkNew,Abc_Obj_t *pNodeOld,int fRecord)

{
  Abc_Ntk_t *pAVar1;
  Hop_Man_t *p;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar2;
  anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 aVar3;
  int iVar4;
  Abc_Obj_t *pAVar5;
  Hop_Obj_t *pHVar6;
  long lVar7;
  Hop_Obj_t *pObj;
  
  if ((*(uint *)&pNodeOld->field_0x14 & 0xf) != 7) {
    __assert_fail("Abc_ObjIsNode(pNodeOld)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcStrash.c"
                  ,0x1da,"Abc_Obj_t *Abc_NodeStrash(Abc_Ntk_t *, Abc_Obj_t *, int)");
  }
  pAVar1 = pNodeOld->pNtk;
  if ((pAVar1->ntkFunc == ABC_FUNC_AIG) && (pAVar1->ntkType != ABC_NTK_STRASH)) {
    p = (Hop_Man_t *)pAVar1->pManFunc;
    aVar2 = pNodeOld->field_5;
    iVar4 = Abc_NodeIsConst(pNodeOld);
    if ((iVar4 == 0) &&
       (pObj = (Hop_Obj_t *)((ulong)aVar2.pData & 0xfffffffffffffffe), p->pConst1 != pObj)) {
      for (lVar7 = 0; lVar7 < (pNodeOld->vFanins).nSize; lVar7 = lVar7 + 1) {
        aVar3 = *(anon_union_8_2_00a17ec8_for_Hop_Obj_t__0 *)
                 ((long)pNodeOld->pNtk->vObjs->pArray[(pNodeOld->vFanins).pArray[lVar7]] + 0x40);
        pHVar6 = Hop_IthVar(p,(int)lVar7);
        pHVar6->field_0 = aVar3;
      }
      Abc_NodeStrash_rec((Abc_Aig_t *)pNtkNew->pManFunc,pObj);
      Hop_ConeUnmark_rec(pObj);
      pAVar5 = (Abc_Obj_t *)(pObj->field_0).pData;
    }
    else {
      pAVar5 = Abc_AigConst1(pNtkNew);
    }
    return (Abc_Obj_t *)((ulong)(aVar2.iData & 1) ^ (ulong)pAVar5);
  }
  __assert_fail("Abc_NtkHasAig(pNodeOld->pNtk) && !Abc_NtkIsStrash(pNodeOld->pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcStrash.c"
                ,0x1db,"Abc_Obj_t *Abc_NodeStrash(Abc_Ntk_t *, Abc_Obj_t *, int)");
}

Assistant:

Abc_Obj_t * Abc_NodeStrash( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pNodeOld, int fRecord )
{
    Hop_Man_t * pMan;
    Hop_Obj_t * pRoot;
    Abc_Obj_t * pFanin;
    int i;
    assert( Abc_ObjIsNode(pNodeOld) );
    assert( Abc_NtkHasAig(pNodeOld->pNtk) && !Abc_NtkIsStrash(pNodeOld->pNtk) );
    // get the local AIG manager and the local root node
    pMan = (Hop_Man_t *)pNodeOld->pNtk->pManFunc;
    pRoot = (Hop_Obj_t *)pNodeOld->pData;
    // check the constant case
    if ( Abc_NodeIsConst(pNodeOld) || Hop_Regular(pRoot) == Hop_ManConst1(pMan) )
        return Abc_ObjNotCond( Abc_AigConst1(pNtkNew), Hop_IsComplement(pRoot) );
    // perform special case-strashing using the record of AIG subgraphs
/*
    if ( fRecord && Abc_NtkRecIsRunning() && Abc_ObjFaninNum(pNodeOld) > 2 && Abc_ObjFaninNum(pNodeOld) <= Abc_NtkRecVarNum() )
    {
        extern Vec_Int_t * Abc_NtkRecMemory();
        extern int Abc_NtkRecStrashNode( Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj, unsigned * pTruth, int nVars );
        int nVars = Abc_NtkRecVarNum();
        Vec_Int_t * vMemory = Abc_NtkRecMemory();
        unsigned * pTruth = Hop_ManConvertAigToTruth( pMan, Hop_Regular(pRoot), nVars, vMemory, 0 );
        assert( Extra_TruthSupportSize(pTruth, nVars) == Abc_ObjFaninNum(pNodeOld) ); // should be swept
        if ( Hop_IsComplement(pRoot) )
            Extra_TruthNot( pTruth, pTruth, nVars );
        if ( Abc_NtkRecStrashNode( pNtkNew, pNodeOld, pTruth, nVars ) )
            return pNodeOld->pCopy;
    }
*/
    // set elementary variables
    Abc_ObjForEachFanin( pNodeOld, pFanin, i )
        Hop_IthVar(pMan, i)->pData = pFanin->pCopy;
    // strash the AIG of this node
    Abc_NodeStrash_rec( (Abc_Aig_t *)pNtkNew->pManFunc, Hop_Regular(pRoot) );
    Hop_ConeUnmark_rec( Hop_Regular(pRoot) );
    // return the final node
    return Abc_ObjNotCond( (Abc_Obj_t *)Hop_Regular(pRoot)->pData, Hop_IsComplement(pRoot) );
}